

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Maybe<capnp::compiler::CompilerMain::Format> __thiscall
capnp::compiler::CompilerMain::parseFormatName(CompilerMain *this,StringPtr name)

{
  bool bVar1;
  Format local_cc;
  StringPtr local_c8;
  Format local_b4;
  StringPtr local_b0;
  Format local_9c;
  StringPtr local_98;
  Format local_84;
  StringPtr local_80;
  Format local_6c;
  StringPtr local_68;
  Format local_54;
  StringPtr local_50;
  Format local_3c;
  StringPtr local_38;
  char *local_28;
  CompilerMain *this_local;
  StringPtr name_local;
  
  this_local = (CompilerMain *)name.content.size_;
  local_28 = name.content.ptr;
  name_local.content.size_ = (size_t)this;
  kj::StringPtr::StringPtr(&local_38,"binary");
  bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_38);
  if (bVar1) {
    local_3c = BINARY;
    kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
              ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_3c);
  }
  else {
    kj::StringPtr::StringPtr(&local_50,"packed");
    bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_50);
    if (bVar1) {
      local_54 = PACKED;
      kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_54);
    }
    else {
      kj::StringPtr::StringPtr(&local_68,"flat");
      bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_68);
      if (bVar1) {
        local_6c = FLAT;
        kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                  ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_6c);
      }
      else {
        kj::StringPtr::StringPtr(&local_80,"flat-packed");
        bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_80);
        if (bVar1) {
          local_84 = FLAT_PACKED;
          kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                    ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_84);
        }
        else {
          kj::StringPtr::StringPtr(&local_98,"canonical");
          bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_98);
          if (bVar1) {
            local_9c = CANONICAL;
            kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                      ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_9c);
          }
          else {
            kj::StringPtr::StringPtr(&local_b0,"text");
            bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_b0);
            if (bVar1) {
              local_b4 = TEXT;
              kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                        ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_b4);
            }
            else {
              kj::StringPtr::StringPtr(&local_c8,"json");
              bVar1 = kj::StringPtr::operator==((StringPtr *)&this_local,&local_c8);
              if (bVar1) {
                local_cc = JSON;
                kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                          ((Maybe<capnp::compiler::CompilerMain::Format> *)this,&local_cc);
              }
              else {
                kj::Maybe<capnp::compiler::CompilerMain::Format>::Maybe
                          ((Maybe<capnp::compiler::CompilerMain::Format> *)this);
              }
            }
          }
        }
      }
    }
  }
  return (Maybe<capnp::compiler::CompilerMain::Format>)
         (NullableValue<capnp::compiler::CompilerMain::Format>)this;
}

Assistant:

kj::Maybe<Format> parseFormatName(kj::StringPtr name) {
    if (name == "binary"     ) return Format::BINARY;
    if (name == "packed"     ) return Format::PACKED;
    if (name == "flat"       ) return Format::FLAT;
    if (name == "flat-packed") return Format::FLAT_PACKED;
    if (name == "canonical"  ) return Format::CANONICAL;
    if (name == "text"       ) return Format::TEXT;
    if (name == "json"       ) return Format::JSON;

    return kj::none;
  }